

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_pipeline_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  uint _h;
  _func_int *p_Var1;
  int *piVar2;
  void *__ptr;
  Allocator *pAVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int _w;
  Mat local_68;
  
  p_Var1 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  _w = *(int *)(&this->field_0xd8 + (long)p_Var1) * *(int *)(&this->field_0xd4 + (long)p_Var1);
  _h = *(uint *)(&this->field_0x108 + (long)p_Var1);
  uVar5 = (long)*(int *)(&this->field_0x104 + (long)p_Var1) / (long)(int)_h;
  uVar5 = (long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)_w;
  lVar4 = (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var1) / (int)_h);
  uVar5 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
  if ((_h == *(uint *)(&this->field_0xd0 + (long)p_Var1)) && ((int)((long)uVar5 / lVar4) * _h == _h)
     ) {
    if (((_h & 7) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape(&local_68,(Mat *)(&this->field_0x168 + (long)p_Var1),_w,_h,(Allocator *)0x0);
      convert_packing(&local_68,&this->weight_data_tm,8,opt);
      if (local_68.refcount != (int *)0x0) {
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount == 0) {
          if (local_68.allocator == (Allocator *)0x0) {
            if (local_68.data != (void *)0x0) {
              free(local_68.data);
            }
          }
          else {
            (*(local_68.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else if (p_Var1 != (_func_int *)0xfffffffffffffec0) {
      piVar2 = *(int **)(&this->field_0x170 + (long)p_Var1);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (this->weight_data_tm).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          __ptr = (this->weight_data_tm).data;
          pAVar3 = (this->weight_data_tm).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])(pAVar3,__ptr,(long)uVar5 % lVar4 & 0xffffffff);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar2 = *(int **)((long)(&this->field_0x168 + (long)p_Var1) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x168 + (long)p_Var1);
      (this->weight_data_tm).refcount = piVar2;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var1);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x180 + (long)p_Var1);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var1);
      uVar6 = *(undefined8 *)(&this->field_0x190 + (long)p_Var1);
      uVar7 = *(undefined8 *)((long)(&this->field_0x190 + (long)p_Var1) + 8);
      (this->weight_data_tm).dims = (int)uVar6;
      (this->weight_data_tm).w = (int)((ulong)uVar6 >> 0x20);
      (this->weight_data_tm).h = (int)uVar7;
      (this->weight_data_tm).d = (int)((ulong)uVar7 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x1a0 + (long)p_Var1);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x1a8 + (long)p_Var1);
    }
  }
  else {
    create_group_ops(this,opt);
    if (opt->lightmode == true) {
      p_Var1 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
      piVar2 = *(int **)(&this->field_0x170 + (long)p_Var1);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (*(long **)(&this->field_0x188 + (long)p_Var1) == (long *)0x0) {
            if (*(void **)(&this->field_0x168 + (long)p_Var1) != (void *)0x0) {
              free(*(void **)(&this->field_0x168 + (long)p_Var1));
            }
          }
          else {
            (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var1) + 0x18))();
          }
        }
      }
      *(undefined8 *)(&this->field_0x1a8 + (long)p_Var1) = 0;
      *(undefined8 *)(&this->field_0x174 + (long)p_Var1) = 0;
      *(undefined8 *)(&this->field_0x17c + (long)p_Var1) = 0;
      *(undefined8 *)(&this->field_0x168 + (long)p_Var1) = 0;
      *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
      *(undefined8 *)(&this->field_0x190 + (long)p_Var1) = 0;
      *(undefined8 *)(&this->field_0x198 + (long)p_Var1) = 0;
      *(undefined4 *)(&this->field_0x1a0 + (long)p_Var1) = 0;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }

        if (elempack == 1)
        {
            weight_data_tm = weight_data;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}